

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_when_free(lysf_ctx *ctx,lysp_when *when)

{
  lysp_ext_instance *local_30;
  lysp_ext_instance *local_20;
  uint64_t c__;
  lysp_when *when_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,when->cond);
  lydict_remove(ctx->ctx,when->dsc);
  lydict_remove(ctx->ctx,when->ref);
  local_20 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (when->exts == (lysp_ext_instance *)0x0) {
      local_30 = (lysp_ext_instance *)0x0;
    }
    else {
      local_30 = when->exts[-1].exts;
    }
    if (local_30 <= local_20) break;
    lysp_ext_instance_free(ctx,when->exts + (long)local_20);
    local_20 = (lysp_ext_instance *)((long)&local_20->name + 1);
  }
  if (when->exts != (lysp_ext_instance *)0x0) {
    free(&when->exts[-1].exts);
  }
  return;
}

Assistant:

void
lysp_when_free(struct lysf_ctx *ctx, struct lysp_when *when)
{
    lydict_remove(ctx->ctx, when->cond);
    lydict_remove(ctx->ctx, when->dsc);
    lydict_remove(ctx->ctx, when->ref);
    FREE_ARRAY(ctx, when->exts, lysp_ext_instance_free);
}